

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int I422ToRGBAMatrix(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
                    int src_stride_v,uint8_t *dst_rgba,int dst_stride_rgba,
                    YuvConstants *yuvconstants,int width,int height)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar6._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar6._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar6._12_4_ = -(uint)(dst_rgba == (uint8_t *)0x0);
  iVar3 = movmskps((int)src_u,auVar6);
  iVar2 = -1;
  if ((height != 0 && 0 < width) && iVar3 == 0) {
    iVar3 = height;
    if (height < 0) {
      iVar3 = -height;
      dst_rgba = dst_rgba + ~height * dst_stride_rgba;
      dst_stride_rgba = -dst_stride_rgba;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar4 = I422ToRGBARow_SSSE3;
    }
    else {
      pcVar4 = I422ToRGBARow_Any_SSSE3;
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar4 = I422ToRGBARow_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar5 = I422ToRGBARow_AVX2;
    }
    else {
      pcVar5 = I422ToRGBARow_Any_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar5 = pcVar4;
    }
    iVar2 = 0;
    if (0 < iVar3) {
      do {
        (*pcVar5)(src_y,src_u,src_v,dst_rgba,yuvconstants,width);
        dst_rgba = dst_rgba + dst_stride_rgba;
        src_y = src_y + src_stride_y;
        src_u = src_u + src_stride_u;
        src_v = src_v + src_stride_v;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int I422ToRGBAMatrix(const uint8_t* src_y,
                     int src_stride_y,
                     const uint8_t* src_u,
                     int src_stride_u,
                     const uint8_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_rgba,
                     int dst_stride_rgba,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I422ToRGBARow)(const uint8_t* y_buf, const uint8_t* u_buf,
                        const uint8_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I422ToRGBARow_C;
  if (!src_y || !src_u || !src_v || !dst_rgba || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgba = dst_rgba + (height - 1) * dst_stride_rgba;
    dst_stride_rgba = -dst_stride_rgba;
  }
#if defined(HAS_I422TORGBAROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToRGBARow = I422ToRGBARow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGBARow = I422ToRGBARow_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TORGBAROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToRGBARow = I422ToRGBARow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToRGBARow = I422ToRGBARow_AVX2;
    }
  }
#endif
#if defined(HAS_I422TORGBAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToRGBARow = I422ToRGBARow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGBARow = I422ToRGBARow_NEON;
    }
  }
#endif
#if defined(HAS_I422TORGBAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToRGBARow = I422ToRGBARow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToRGBARow = I422ToRGBARow_MMI;
    }
  }
#endif
#if defined(HAS_I422TORGBAROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToRGBARow = I422ToRGBARow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGBARow = I422ToRGBARow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422ToRGBARow(src_y, src_u, src_v, dst_rgba, yuvconstants, width);
    dst_rgba += dst_stride_rgba;
    src_y += src_stride_y;
    src_u += src_stride_u;
    src_v += src_stride_v;
  }
  return 0;
}